

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O2

void __thiscall
poplar::
compact_bonsai_trie<80U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::compact_bonsai_trie
          (compact_bonsai_trie<80U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
           *this,compact_bonsai_trie<80U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                 *param_1)

{
  pointer puVar1;
  uint64_t uVar2;
  pointer psVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar8;
  vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  *pvVar9;
  undefined4 uVar10;
  uint32_t uVar11;
  undefined4 uVar12;
  uint32_t uVar13;
  undefined4 uVar14;
  
  (this->hasher_).univ_size_.mask_ = (param_1->hasher_).univ_size_.mask_;
  uVar10 = *(undefined4 *)&(param_1->hasher_).field_0x4;
  uVar11 = (param_1->hasher_).univ_size_.bits_;
  uVar12 = *(undefined4 *)&(param_1->hasher_).univ_size_.field_0x4;
  (this->hasher_).shift_ = (param_1->hasher_).shift_;
  *(undefined4 *)&(this->hasher_).field_0x4 = uVar10;
  (this->hasher_).univ_size_.bits_ = uVar11;
  *(undefined4 *)&(this->hasher_).univ_size_.field_0x4 = uVar12;
  puVar1 = (param_1->table_).chunks_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar8 = &(param_1->table_).chunks_;
  (pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (param_1->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->table_).width_ = (param_1->table_).width_;
  uVar2 = (param_1->table_).mask_;
  (this->table_).size_ = (param_1->table_).size_;
  (this->table_).mask_ = uVar2;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::compact_hash_table
            (&this->aux_cht_,&param_1->aux_cht_);
  psVar3 = (param_1->aux_map_).table_.
           super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->aux_map_).table_.
       super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar3;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->aux_map_).table_.
       super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar9 = &(param_1->aux_map_).table_;
  (pvVar9->
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (pvVar9->
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  uVar2 = (param_1->aux_map_).max_size_;
  uVar11 = (param_1->aux_map_).capa_size_.bits_;
  uVar10 = *(undefined4 *)&(param_1->aux_map_).capa_size_.field_0x4;
  uVar4 = (param_1->aux_map_).capa_size_.mask_;
  (this->aux_map_).size_ = (param_1->aux_map_).size_;
  (this->aux_map_).max_size_ = uVar2;
  (this->aux_map_).capa_size_.bits_ = uVar11;
  *(undefined4 *)&(this->aux_map_).capa_size_.field_0x4 = uVar10;
  (this->aux_map_).capa_size_.mask_ = uVar4;
  uVar2 = param_1->size_;
  uVar4 = param_1->max_size_;
  uVar13 = (param_1->capa_size_).bits_;
  uVar14 = *(undefined4 *)&(param_1->capa_size_).field_0x4;
  uVar5 = (param_1->capa_size_).mask_;
  uVar10 = *(undefined4 *)&(param_1->capa_size_).field_0x4;
  uVar6 = (param_1->capa_size_).mask_;
  uVar11 = (param_1->symb_size_).bits_;
  uVar12 = *(undefined4 *)&(param_1->symb_size_).field_0x4;
  uVar7 = (param_1->symb_size_).mask_;
  (this->capa_size_).bits_ = (param_1->capa_size_).bits_;
  *(undefined4 *)&(this->capa_size_).field_0x4 = uVar10;
  (this->capa_size_).mask_ = uVar6;
  (this->symb_size_).bits_ = uVar11;
  *(undefined4 *)&(this->symb_size_).field_0x4 = uVar12;
  (this->symb_size_).mask_ = uVar7;
  this->size_ = uVar2;
  this->max_size_ = uVar4;
  (this->capa_size_).bits_ = uVar13;
  *(undefined4 *)&(this->capa_size_).field_0x4 = uVar14;
  (this->capa_size_).mask_ = uVar5;
  return;
}

Assistant:

compact_bonsai_trie(compact_bonsai_trie&&) noexcept = default;